

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

void __thiscall clunk::Node::GetKingMoves<false,true>(Node *this,int depth)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  long lVar5;
  int score;
  int iVar6;
  uint cap;
  ulong uVar7;
  Move *this_00;
  ulong uVar8;
  ulong uVar9;
  uint sqr;
  uint local_44;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x77d,"void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]"
                 );
  }
  if (*_KING != '\f') {
    __assert_fail("_KING[color]->type == (color|King)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x77e,"void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]"
                 );
  }
  bVar1 = _KING[1];
  uVar8 = (ulong)bVar1;
  if ((bVar1 & 0x88) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x781,"void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]"
                 );
  }
  if ((undefined *)(&_board)[uVar8] != _KING) {
    __assert_fail("_board[from] == _KING[color]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x782,"void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]"
                 );
  }
  local_44 = 0;
  if (depth == 0) {
    local_44 = GetDiscoverDir(this,false,(uint)bVar1);
  }
  uVar9 = *(ulong *)((long)&_queenKing + (ulong)((uint)bVar1 * 8 | 0x40));
  if (uVar9 != 0) {
    do {
      if ((uVar9 & 0xff) == 0) {
        __assert_fail("mvs & 0xFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x78b,
                      "void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]");
      }
      sqr = (int)(uVar9 & 0xff) - 1;
      if ((sqr & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x100,"int clunk::Distance(const int, const int)");
      }
      uVar7 = (ulong)sqr;
      if ((&_dist)[uVar7 + (ulong)bVar1 * 0x80] != '\x01') {
        __assert_fail("Distance(from, to) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x78d,
                      "void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]");
      }
      bVar2 = (&_dir)[uVar7 + (ulong)bVar1 * 0x80];
      if (((0x11 < bVar2) || ((0x38002U >> (bVar2 & 0x1f) & 1) == 0)) &&
         ((0x10 < bVar2 - 0xef || ((0x10007U >> (bVar2 - 0xef & 0x1f) & 1) == 0)))) {
        __assert_fail("IS_DIR(Direction(from, to))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x78e,
                      "void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]");
      }
      bVar3 = *(byte *)(&_board)[uVar7];
      if ((bVar3 == 0) && ((byte *)(&_board)[uVar7] != _EMPTY)) {
        __assert_fail("cap || (_board[to] == _EMPTY)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x791,
                      "void clunk::Node::GetKingMoves(const int) [color = false, qsearch = true]");
      }
      cap = (uint)bVar3;
      if (cap == 0) {
        if (((local_44 != 0) &&
            (local_44 != (byte)((bVar2 ^ (char)bVar2 >> 7) - ((char)bVar2 >> 7)))) &&
           (bVar4 = AttackedBy<true>(sqr), !bVar4)) {
          iVar6 = this->moveCount;
          lVar5 = (long)iVar6;
          if (lVar5 < 0) goto LAB_00130a73;
          if (0x7e < iVar6) goto LAB_00130a92;
          score = (*(int *)(_SQR + uVar7 * 4) - *(int *)(_SQR + uVar8 * 4)) + -10;
          this->moveCount = iVar6 + 1;
          cap = 0;
          goto LAB_001309a1;
        }
      }
      else if (((bVar3 & 1) != 0) && (bVar4 = AttackedBy<true>(sqr), !bVar4)) {
        if (9 < bVar3 - 2) {
          __assert_fail("!pc || IS_CAP(pc)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x114,"int clunk::ValueOf(const int)");
        }
        iVar6 = this->moveCount;
        lVar5 = (long)iVar6;
        if (lVar5 < 0) {
LAB_00130a73:
          __assert_fail("moveCount >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x60d,
                        "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                       );
        }
        if (0x7e < iVar6) {
LAB_00130a92:
          __assert_fail("(moveCount + 1) < MaxMoves",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x60e,
                        "void clunk::Node::AddMove(const MoveType, const int, const int, const int, const int, const int)"
                       );
        }
        score = ((*(int *)(_VALUE_OF + (ulong)cap * 4) + *(int *)(_SQR + uVar7 * 4)) -
                *(int *)(_SQR + uVar8 * 4)) + -0x50;
        this->moveCount = iVar6 + 1;
LAB_001309a1:
        this_00 = this->moves + lVar5;
        Move::Set(this_00,KingMove,(uint)bVar1,sqr,cap,0,score);
        iVar6 = 0;
        if (this_00->bits == this->killer[1].bits) {
          iVar6 = 0x32;
        }
        if (this_00->bits == this->killer[0].bits) {
          iVar6 = 0x32;
        }
        Move::IncScore(this_00,iVar6);
      }
      bVar4 = 0xff < uVar9;
      uVar9 = uVar9 >> 8;
    } while (bVar4);
  }
  return;
}

Assistant:

void GetKingMoves(const int depth) {
    assert(!checks);
    assert(_KING[color]->type == (color|King));

    const int from = _KING[color]->sqr;
    assert(IS_SQUARE(from));
    assert(_board[from] == _KING[color]);

    int kdir = 0;
    if (qsearch & (!depth)) {
      kdir = GetDiscoverDir(color, from);
    }

    int score;
    for (uint64_t mvs = _queenKing[from + 8]; mvs; mvs >>= 8) {
      assert(mvs & 0xFF);
      const int to = ((mvs & 0xFF) - 1);
      assert(Distance(from, to) == 1);
      assert(IS_DIR(Direction(from, to)));
      if (qsearch) {
        const int cap = _board[to]->type;
        assert(cap || (_board[to] == _EMPTY));
        if (cap) {
          if ((COLOR(cap) != color) && !AttackedBy<!color>(to)) {
            score = (ValueOf(cap) + _SQR[to] - _SQR[from] - 80);
            AddMove(KingMove, from, to, score, cap);
          }
        }
        else if (kdir && (kdir != abs(Direction(from, to)))) {
          if (!AttackedBy<!color>(to)) {
            score = (_SQR[to] - _SQR[from] - 10);
            AddMove(KingMove, from, to, score);
          }
        }
      }
      else if (!AttackedBy<!color>(to)) {
        const int cap = _board[to]->type;
        assert(cap || (_board[to] == _EMPTY));
        if (!cap) {
          score = (_SQR[to] - _SQR[from] - 20);
          AddMove(KingMove, from, to, score);
          if ((to == (color ? F8 : F1)) &&
              (state & (color ? BlackShort : WhiteShort)) &&
              (_board[color ? G8 : G1] == _EMPTY) &&
              !AttackedBy<!color>(color ? G8 : G1))
          {
            assert(from == (color ? E8 : E1));
            assert(_board[color ? H8 : H1]->type == (color|Rook));
            AddMove(CastleShort, from, (color ? G8 : G1), 50);
          }
          else if ((to == (color ? D8 : D1)) &&
                   (state & (color ? BlackLong : WhiteLong)) &&
                   (_board[color ? C8 : C1] == _EMPTY) &&
                   (_board[color ? B8 : B1] == _EMPTY) &&
                   !AttackedBy<!color>(color ? C8 : C1))
          {
            assert(from == (color ? E8 : E1));
            assert(_board[color ? A8 : A1]->type == (color|Rook));
            AddMove(CastleLong, from, (color ? C8 : C1), 50);
          }
        }
        else if (COLOR(cap) != color) {
          score = (ValueOf(cap) + _SQR[to] - _SQR[from] - 80);
          AddMove(KingMove, from, to, score, cap);
        }
      }
    }
  }